

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcCommon.h
# Opt level: O0

void o3dgc::CubeToSphere(Real a,Real b,char index,Real *x,Real *y,Real *z)

{
  double dVar1;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  Real *local_30;
  Real *z_local;
  Real *y_local;
  Real *x_local;
  Real local_10;
  Real RStack_c;
  char index_local;
  Real b_local;
  Real a_local;
  
  local_30 = z;
  z_local = y;
  y_local = x;
  x_local._7_1_ = index;
  local_10 = b;
  RStack_c = a;
  switch(index) {
  case '\0':
    *x = a;
    *y = b;
    local_38 = 0.0;
    local_40 = (1.0 - (double)(*x * *x)) - (double)(*y * *y);
    dVar1 = max<double>(&local_38,&local_40);
    dVar1 = sqrt(dVar1);
    *local_30 = (float)dVar1;
    break;
  case '\x01':
    *x = -a;
    *y = -b;
    local_48 = 0.0;
    local_50 = (1.0 - (double)(*x * *x)) - (double)(*y * *y);
    dVar1 = max<double>(&local_48,&local_50);
    dVar1 = sqrt(dVar1);
    *local_30 = -(float)dVar1;
    break;
  case '\x02':
    *z = a;
    *x = b;
    local_58 = 0.0;
    local_60 = (1.0 - (double)(*x * *x)) - (double)(*z * *z);
    dVar1 = max<double>(&local_58,&local_60);
    dVar1 = sqrt(dVar1);
    *z_local = (float)dVar1;
    break;
  case '\x03':
    *z = -a;
    *x = -b;
    local_68 = 0.0;
    local_70 = (1.0 - (double)(*x * *x)) - (double)(*z * *z);
    dVar1 = max<double>(&local_68,&local_70);
    dVar1 = sqrt(dVar1);
    *z_local = -(float)dVar1;
    break;
  case '\x04':
    *y = a;
    *z = b;
    local_78 = 0.0;
    local_80 = (1.0 - (double)(*y * *y)) - (double)(*z * *z);
    dVar1 = max<double>(&local_78,&local_80);
    dVar1 = sqrt(dVar1);
    *y_local = (float)dVar1;
    break;
  case '\x05':
    *y = -a;
    *z = -b;
    local_88 = 0.0;
    local_90 = (1.0 - (double)(*y * *y)) - (double)(*z * *z);
    dVar1 = max<double>(&local_88,&local_90);
    dVar1 = sqrt(dVar1);
    *y_local = -(float)dVar1;
  }
  return;
}

Assistant:

inline void CubeToSphere(const Real a, const Real b, const char index,
                             Real & x, Real & y, Real & z)
    {
        switch( index )
        {
        case 0:
            x = a;
            y = b;
            z =  (Real) sqrt(max(0.0, 1.0 - x*x-y*y));
            break;
        case 1:
            x = -a;
            y = -b;
            z = -(Real) sqrt(max(0.0, 1.0 - x*x-y*y));
            break;
        case 2:
            z = a;
            x = b;
            y =  (Real) sqrt(max(0.0, 1.0 - x*x-z*z));
            break;
        case 3:
            z = -a;
            x = -b;
            y = -(Real) sqrt(max(0.0, 1.0 - x*x-z*z));
            break;
        case 4:
            y = a;
            z = b;
            x =  (Real) sqrt(max(0.0, 1.0 - y*y-z*z));
            break;
        case 5:
            y = -a;
            z = -b;
            x = -(Real) sqrt(max(0.0, 1.0 - y*y-z*z));
            break;
        }
    }